

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mock_gl_engine.cpp
# Opt level: O2

void __thiscall
polyscope::render::backend_openGL_mock::GLShaderProgram::setAttribute
          (GLShaderProgram *this,string *name,vector<int,_std::allocator<int>_> *data,bool update,
          int offset,int size)

{
  pointer piVar1;
  pointer piVar2;
  pointer pGVar3;
  __type _Var4;
  invalid_argument *piVar5;
  uint uVar6;
  ulong uVar7;
  pointer __lhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  vector<int,_std::allocator<int>_> intData;
  string local_e8;
  string local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  std::vector<int,_std::allocator<int>_>::vector
            (&intData,(long)(data->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)(data->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                            super__Vector_impl_data._M_start >> 2,(allocator_type *)&local_120);
  piVar1 = (data->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  piVar2 = (data->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  for (uVar6 = 0; uVar7 = (ulong)uVar6, uVar7 < (ulong)((long)piVar2 - (long)piVar1 >> 2);
      uVar6 = uVar6 + 1) {
    intData.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
    [uVar7] = piVar1[uVar7];
  }
  __lhs = (this->attributes).
          super__Vector_base<polyscope::render::backend_openGL_mock::GLShaderProgram::GLShaderAttribute,_std::allocator<polyscope::render::backend_openGL_mock::GLShaderProgram::GLShaderAttribute>_>
          ._M_impl.super__Vector_impl_data._M_start;
  pGVar3 = (this->attributes).
           super__Vector_base<polyscope::render::backend_openGL_mock::GLShaderProgram::GLShaderAttribute,_std::allocator<polyscope::render::backend_openGL_mock::GLShaderProgram::GLShaderAttribute>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  while( true ) {
    if (__lhs == pGVar3) {
      piVar5 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::operator+(&local_120,"No attribute with name ",name);
      std::invalid_argument::invalid_argument(piVar5,(string *)&local_120);
      __cxa_throw(piVar5,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
    _Var4 = std::operator==(&__lhs->name,name);
    if (_Var4) break;
    __lhs = __lhs + 1;
  }
  if (__lhs->type == Int) {
    if (!update) {
      __lhs->dataSize =
           (long)(data->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(data->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start >> 2;
    }
    geometrycentral::surface::std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&intData);
    return;
  }
  piVar5 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::operator+(&local_a8,"Tried to set GLShaderAttribute named ",name);
  std::operator+(&local_88,&local_a8," with wrong type. Actual type: ");
  std::__cxx11::to_string(&local_c8,__lhs->type);
  std::operator+(&local_68,&local_88,&local_c8);
  std::operator+(&local_48,&local_68,"  Attempted type: ");
  std::__cxx11::to_string(&local_e8,5);
  std::operator+(&local_120,&local_48,&local_e8);
  std::invalid_argument::invalid_argument(piVar5,(string *)&local_120);
  __cxa_throw(piVar5,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

void GLShaderProgram::setAttribute(std::string name, const std::vector<int>& data, bool update, int offset, int size) {
  // FIXME I've seen strange bugs when using int's in shaders. Need to figure
  // out it it's my shaders or something wrong with this function

  // Convert data to GL_INT (probably does nothing)
  std::vector<int> intData(data.size());
  for (unsigned int i = 0; i < data.size(); i++) {
    intData[i] = static_cast<int>(data[i]);
  }

  for (GLShaderAttribute& a : attributes) {
    if (a.name == name) {
      if (a.type == DataType::Int) {
        if (update) {
          // TODO: Allow modifications to non-contiguous memory
          offset *= sizeof(int);
          if (size == -1)
            size = a.dataSize * sizeof(int);
          else
            size *= sizeof(int);

        } else {
          a.dataSize = data.size();
        }
      } else {
        throw std::invalid_argument("Tried to set GLShaderAttribute named " + name +
                                    " with wrong type. Actual type: " + std::to_string(static_cast<int>(a.type)) +
                                    "  Attempted type: " + std::to_string(static_cast<int>(DataType::Int)));
      }
      return;
    }
  }

  throw std::invalid_argument("No attribute with name " + name);
}